

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# put_data.cpp
# Opt level: O1

void __thiscall libtorrent::dht::put_data::done(put_data *this)

{
  uint uVar1;
  dht_observer *pdVar2;
  int iVar3;
  undefined4 extraout_var;
  int local_1c;
  
  this->m_done = true;
  pdVar2 = ((this->super_traversal_algorithm).m_node)->m_observer;
  uVar1 = (this->super_traversal_algorithm).m_id;
  iVar3 = (*(this->super_traversal_algorithm)._vptr_traversal_algorithm[2])();
  (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
            (pdVar2,4,"[%u] %s DONE, response %d, timeout %d",(ulong)uVar1,
             CONCAT44(extraout_var,iVar3),
             (ulong)(uint)(int)(this->super_traversal_algorithm).m_responses,
             (int)(this->super_traversal_algorithm).m_timeouts);
  local_1c = (int)(this->super_traversal_algorithm).m_responses;
  if ((this->m_put_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_put_callback)._M_invoker)((_Any_data *)&this->m_put_callback,&this->m_data,&local_1c)
    ;
    traversal_algorithm::done(&this->super_traversal_algorithm);
    return;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void put_data::done()
{
	m_done = true;

#ifndef TORRENT_DISABLE_LOGGING
	get_node().observer()->log(dht_logger::traversal, "[%u] %s DONE, response %d, timeout %d"
		, id(), name(), num_responses(), num_timeouts());
#endif

	m_put_callback(m_data, num_responses());
	traversal_algorithm::done();
}